

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::ComputePipeline>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,undefined8 param_3,
          Parameters *param_4)

{
  Parameters *extraout_RDX;
  string local_138;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_118;
  Resources res;
  Environment env;
  
  Environment::Environment(&env,(Context *)this,1);
  ComputePipeline::Resources::Resources(&res,&env,extraout_RDX);
  ComputePipeline::create((Move<vk::Handle<(vk::HandleType)18>_> *)&local_118,&env,&res,param_4);
  local_138.field_2._M_allocated_capacity = (size_type)local_118.m_data.deleter.m_device;
  local_138.field_2._8_8_ = local_118.m_data.deleter.m_allocator;
  local_138._M_dataplus._M_p = (pointer)local_118.m_data.object.m_internal;
  local_138._M_string_length = (size_type)local_118.m_data.deleter.m_deviceIface;
  local_118.m_data.object.m_internal = 0;
  local_118.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_118.m_data.deleter.m_device = (VkDevice)0x0;
  local_118.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_118);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"Ok",(allocator<char> *)&local_118);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  ComputePipeline::Resources::~Resources(&res);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}